

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KruskalMST.h
# Opt level: O2

double __thiscall KruskalMST::operator()(KruskalMST *this)

{
  pointer pEVar1;
  bool bVar2;
  socklen_t in_ECX;
  int N;
  Edge *edge;
  pointer pEVar3;
  UFS ufs;
  double local_38;
  UFS local_30;
  
  N = this->n;
  UFS::UFS(&local_30,N);
  pEVar3 = (this->edges).super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->edges).super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_38 = 0.0;
  for (; pEVar3 != pEVar1; pEVar3 = pEVar3 + 1) {
    bVar2 = UFS::connected(&local_30,pEVar3->from,pEVar3->to);
    if (!bVar2) {
      UFS::connect(&local_30,pEVar3->from,(sockaddr *)(ulong)(uint)pEVar3->to,in_ECX);
      local_38 = local_38 + pEVar3->w;
      N = N + -1;
      if (N == 1) break;
    }
  }
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&local_30.fa);
  return local_38;
}

Assistant:

double operator()() const
	{
		double ans = 0.0;
		int need = n;
		UFS ufs(n);
		for (auto &edge : edges)
		{
			if (!ufs.connected(edge.from, edge.to))
			{
				ufs.connect(edge.from, edge.to);
				ans += edge.w;
				if (--need == 1)
					break;
			}
		}
		return ans;
	}